

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shaders.cpp
# Opt level: O3

void __thiscall fw::Shader::addSourceFromFile(Shader *this,string *filename)

{
  byte bVar1;
  Writer *pWVar2;
  string shaderCode;
  string local_c0;
  Writer local_a0;
  
  local_a0._vptr_Writer = (_func_int **)&PTR__Writer_001f54f0;
  local_a0.m_level = Debug;
  local_a0.m_file =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/source/framework/Shaders.cpp"
  ;
  local_a0.m_line = 0x25;
  local_a0.m_func = "void fw::Shader::addSourceFromFile(const string &)";
  local_a0.m_verboseLevel = 0;
  local_a0.m_logger = (Logger *)0x0;
  local_a0.m_proceed = false;
  local_a0.m_messageBuilder.m_logger = (Logger *)0x0;
  local_a0.m_messageBuilder.m_containerLogSeperator = "";
  local_a0.m_dispatchAction = NormalLog;
  local_a0.m_loggerIds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a0.m_loggerIds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0.m_loggerIds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pWVar2 = el::base::Writer::construct(&local_a0,1,"framework");
  bVar1 = pWVar2->m_proceed;
  if ((bool)bVar1 == true) {
    el::base::MessageBuilder::operator<<
              (&pWVar2->m_messageBuilder,"Loading shader source from file: ");
    bVar1 = pWVar2->m_proceed;
  }
  if ((bVar1 & 1) != 0) {
    el::base::MessageBuilder::operator<<(&pWVar2->m_messageBuilder,(filename->_M_dataplus)._M_p);
  }
  el::base::Writer::~Writer(&local_a0);
  loadASCIITextFile(&local_c0,filename);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->_sources,&local_c0);
  local_a0._vptr_Writer = (_func_int **)&PTR__Writer_001f54f0;
  local_a0.m_level = Debug;
  local_a0.m_file =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/source/framework/Shaders.cpp"
  ;
  local_a0.m_line = 0x28;
  local_a0.m_func = "void fw::Shader::addSourceFromFile(const string &)";
  local_a0.m_verboseLevel = 0;
  local_a0.m_logger = (Logger *)0x0;
  local_a0.m_proceed = false;
  local_a0.m_messageBuilder.m_logger = (Logger *)0x0;
  local_a0.m_messageBuilder.m_containerLogSeperator = "";
  local_a0.m_dispatchAction = NormalLog;
  local_a0.m_loggerIds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a0.m_loggerIds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0.m_loggerIds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pWVar2 = el::base::Writer::construct(&local_a0,1,"framework");
  if (pWVar2->m_proceed == true) {
    el::base::MessageBuilder::operator<<(&pWVar2->m_messageBuilder,"Shader loaded succesfully");
  }
  el::base::Writer::~Writer(&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Shader::addSourceFromFile(const string &filename)
{
    LOG(DEBUG) << "Loading shader source from file: " << filename;
    string shaderCode = loadASCIITextFile(filename);
    _sources.push_back(shaderCode);
    LOG(DEBUG) << "Shader loaded succesfully";
}